

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5PorterStep1A(char *aBuf,int *pnBuf)

{
  int iVar1;
  int nBuf;
  int *pnBuf_local;
  char *aBuf_local;
  
  iVar1 = *pnBuf;
  if (aBuf[iVar1 + -1] == 's') {
    if (aBuf[iVar1 + -2] == 'e') {
      if ((((iVar1 < 5) || (aBuf[iVar1 + -4] != 's')) || (aBuf[iVar1 + -3] != 's')) &&
         ((iVar1 < 4 || (aBuf[iVar1 + -3] != 'i')))) {
        *pnBuf = iVar1 + -1;
      }
      else {
        *pnBuf = iVar1 + -2;
      }
    }
    else if (aBuf[iVar1 + -2] != 's') {
      *pnBuf = iVar1 + -1;
    }
  }
  return;
}

Assistant:

static void fts5PorterStep1A(char *aBuf, int *pnBuf){
  int nBuf = *pnBuf;
  if( aBuf[nBuf-1]=='s' ){
    if( aBuf[nBuf-2]=='e' ){
      if( (nBuf>4 && aBuf[nBuf-4]=='s' && aBuf[nBuf-3]=='s') 
       || (nBuf>3 && aBuf[nBuf-3]=='i' )
      ){
        *pnBuf = nBuf-2;
      }else{
        *pnBuf = nBuf-1;
      }
    }
    else if( aBuf[nBuf-2]!='s' ){
      *pnBuf = nBuf-1;
    }
  }
}